

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O0

void helper_neon_zip16_aarch64(void *vd,void *vm)

{
  ulong uVar1;
  ulong uVar2;
  uint64_t m0;
  uint64_t d0;
  uint64_t zm;
  uint64_t zd;
  uint64_t *rm;
  uint64_t *rd;
  void *vm_local;
  void *vd_local;
  
  uVar1 = *vd;
  uVar2 = *vm;
  *(ulong *)vm = uVar1 >> 0x20 & 0xffff | (uVar2 >> 0x20 & 0xffff) << 0x10 | (uVar1 >> 0x30) << 0x20
                 | uVar2 & 0xffff000000000000;
  *(ulong *)vd = uVar1 & 0xffff | (uVar2 & 0xffff) << 0x10 | (uVar1 >> 0x10 & 0xffff) << 0x20 |
                 (uVar2 >> 0x10) << 0x30;
  return;
}

Assistant:

void HELPER(neon_zip16)(void *vd, void *vm)
{
    uint64_t *rd = vd, *rm = vm;
    uint64_t zd = rd[0], zm = rm[0];

    uint64_t d0 = ELEM(zd, 0, 16) | (ELEM(zm, 0, 16) << 16)
        | (ELEM(zd, 1, 16) << 32) | (ELEM(zm, 1, 16) << 48);
    uint64_t m0 = ELEM(zd, 2, 16) | (ELEM(zm, 2, 16) << 16)
        | (ELEM(zd, 3, 16) << 32) | (ELEM(zm, 3, 16) << 48);

    rm[0] = m0;
    rd[0] = d0;
}